

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O2

word Hop_ManComputeTruth6(Hop_Man_t *p,Hop_Obj_t *pObj,int nVars)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  word wVar3;
  
  iVar1 = Hop_ObjIsConst1((Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe));
  if (iVar1 == 0) {
    iVar1 = 0;
    if (nVars < 1) {
      nVars = iVar1;
    }
    for (; nVars != iVar1; iVar1 = iVar1 + 1) {
      pHVar2 = Hop_ManPi(p,iVar1);
      (pHVar2->field_0).iData = iVar1;
    }
    wVar3 = Hop_ManComputeTruth6_rec(p,(Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe));
    wVar3 = -(ulong)((uint)pObj & 1) ^ wVar3;
  }
  else {
    wVar3 = (ulong)((uint)pObj & 1) - 1;
  }
  return wVar3;
}

Assistant:

word Hop_ManComputeTruth6( Hop_Man_t * p, Hop_Obj_t * pObj, int nVars )
{
    word Truth;
    int i;
    if ( Hop_ObjIsConst1( Hop_Regular(pObj) ) )
        return Hop_IsComplement(pObj) ? 0 : ~(word)0;
    for ( i = 0; i < nVars; i++ )
        Hop_ManPi( p, i )->iData = i;
    Truth = Hop_ManComputeTruth6_rec( p, Hop_Regular(pObj) );
    return Hop_IsComplement(pObj) ? ~Truth : Truth;
}